

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::CorruptionError(Iter *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_ffffffffffffffb0;
  Slice *msg;
  Slice *in_stack_ffffffffffffffb8;
  Status *this_01;
  Slice local_30;
  undefined1 local_20 [32];
  
  local_20._24_8_ = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 0x38);
  *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RDI + 0x3c);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20;
  Slice::Slice(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  msg = &local_30;
  Slice::Slice((Slice *)this_00);
  this_01 = (Status *)(local_20 + 0x10);
  Status::Corruption(msg,(Slice *)this_00);
  Status::operator=(this_01,(Status *)msg);
  Status::~Status((Status *)this_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(this_00);
  Slice::clear((Slice *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20._24_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CorruptionError() {
    current_ = restarts_;
    restart_index_ = num_restarts_;
    status_ = Status::Corruption("bad entry in block");
    key_.clear();
    value_.clear();
  }